

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbutton.cpp
# Opt level: O1

QSize __thiscall QtMWidgets::NavigationButton::sizeHint(NavigationButton *this)

{
  int iVar1;
  uint uVar2;
  int extraout_var;
  ulong uVar3;
  undefined1 auVar4 [16];
  QString local_40;
  
  QFontMetrics::QFontMetrics((QFontMetrics *)&local_40,(QFont *)(*(long *)&this->field_0x20 + 0x38))
  ;
  QAbstractButton::text();
  auVar4 = QFontMetrics::boundingRect(&local_40);
  if ((QArrayData *)local_40.d.ptr != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_40.d.ptr)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_40.d.ptr)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_40.d.ptr)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_40.d.ptr,2,8);
    }
  }
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_40);
  iVar1 = (**(code **)(*(long *)this + 0x78))(this);
  (**(code **)(*(long *)this + 0x78))(this);
  uVar2 = (auVar4._12_4_ - auVar4._4_4_) + 1;
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < extraout_var) {
    uVar3 = (**(code **)(*(long *)this + 0x78))(this);
    uVar3 = uVar3 >> 0x20;
  }
  return (QSize)((ulong)((auVar4._8_4_ - auVar4._0_4_) + iVar1 + 0x15) | uVar3 << 0x20);
}

Assistant:

QSize
NavigationButton::sizeHint() const
{
	const QRect & b = fontMetrics().boundingRect( text() );

	return QSize( minimumSizeHint().width() + b.width() + c_offset * 2,
		( minimumSizeHint().height() > b.height() ?
			minimumSizeHint().height() : b.height() ) );
}